

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileContext.cpp
# Opt level: O1

CompileResult __thiscall enact::CompileContext::compile(CompileContext *this,string *source)

{
  ostream *poVar1;
  pointer puVar2;
  AstSerialise serialise;
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ast;
  char local_c1;
  undefined *local_c0;
  undefined **local_b8;
  undefined **local_b0;
  string local_a8;
  undefined **local_88;
  undefined *puStack_80;
  undefined **local_78;
  _Alloc_hider _Stack_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_60;
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  local_48;
  
  std::__cxx11::string::operator=((string *)this,(string *)source);
  Parser::parse(&local_48,&this->m_parser);
  _Stack_70._M_p = (pointer)&aStack_60;
  aStack_60._8_8_ = 0;
  local_b8 = &PTR_visitBreakStmt_abi_cxx11__00129b78;
  local_88 = &PTR_visitBreakStmt_abi_cxx11__00129b78;
  local_c0 = &DAT_00129c90;
  puStack_80 = &DAT_00129c90;
  local_b0 = &PTR_visitValuePattern_abi_cxx11__00129d48;
  local_78 = &PTR_visitValuePattern_abi_cxx11__00129d48;
  local_68 = 0;
  aStack_60._M_allocated_capacity = 0;
  puVar2 = local_48.
           super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    AstSerialise::operator()[abi_cxx11_
              (&local_a8,(AstSerialise *)&local_88,
               (puVar2->_M_t).super___uniq_ptr_impl<enact::Stmt,_std::default_delete<enact::Stmt>_>.
               _M_t.super__Tuple_impl<0UL,_enact::Stmt_*,_std::default_delete<enact::Stmt>_>.
               super__Head_base<0UL,_enact::Stmt_*,_false>._M_head_impl);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    local_c1 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_c1,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    puVar2 = puVar2 + 1;
  } while( true );
}

Assistant:

CompileResult CompileContext::compile(std::string source) {
        m_source = std::move(source);

        std::vector<std::unique_ptr<Stmt>> ast = m_parser.parse();
        // TODO: serialise and print AST

        AstSerialise serialise{};
        for (const std::unique_ptr<Stmt>& stmt : ast) {
            std::cout << serialise(*stmt) << '\n';
        }
    }